

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

size_t qHash<std::pair<QString,QString>>(QList<std::pair<QString,_QString>_> *key,size_t seed)

{
  const_iterator seed_00;
  size_t sVar1;
  const_iterator unaff_retaddr;
  const_iterator in_stack_00000008;
  QList<std::pair<QString,_QString>_> *in_stack_ffffffffffffffe0;
  
  seed_00 = QList<std::pair<QString,_QString>_>::cbegin(in_stack_ffffffffffffffe0);
  QList<std::pair<QString,_QString>_>::cend(in_stack_ffffffffffffffe0);
  sVar1 = qHashRange<QList<std::pair<QString,QString>>::const_iterator>
                    (in_stack_00000008,unaff_retaddr,(size_t)seed_00.i);
  return sVar1;
}

Assistant:

size_t qHash(const QList<T> &key, size_t seed = 0)
    noexcept(noexcept(qHashRange(key.cbegin(), key.cend(), seed)))
{
    return qHashRange(key.cbegin(), key.cend(), seed);
}